

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::QuadMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  long lVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  ulong uVar4;
  char *pcVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [16];
  size_t sVar15;
  ulong uVar16;
  undefined4 uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  undefined1 auVar30 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar26 [64];
  undefined1 auVar28 [64];
  
  aVar25.m128[2] = INFINITY;
  aVar25._0_8_ = 0x7f8000007f800000;
  aVar25.m128[3] = INFINITY;
  auVar26 = ZEXT1664((undefined1  [16])aVar25);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar25;
  aVar27.m128[2] = -INFINITY;
  aVar27._0_8_ = 0xff800000ff800000;
  aVar27.m128[3] = -INFINITY;
  auVar28 = ZEXT1664((undefined1  [16])aVar27);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar27;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar19 = r->_begin;
  sVar15 = __return_storage_ptr__->end;
  aVar31 = aVar25;
  aVar29 = aVar27;
  if (uVar19 < r->_end) {
    auVar33._8_4_ = 0x7f800000;
    auVar33._0_8_ = 0x7f8000007f800000;
    auVar33._12_4_ = 0x7f800000;
    auVar34._8_4_ = 0xff800000;
    auVar34._0_8_ = 0xff800000ff800000;
    auVar34._12_4_ = 0xff800000;
    auVar35._8_4_ = 0xddccb9a2;
    auVar35._0_8_ = 0xddccb9a2ddccb9a2;
    auVar35._12_4_ = 0xddccb9a2;
    auVar36._8_4_ = 0x5dccb9a2;
    auVar36._0_8_ = 0x5dccb9a25dccb9a2;
    auVar36._12_4_ = 0x5dccb9a2;
    auVar32 = ZEXT1664((undefined1  [16])aVar25);
    auVar30 = ZEXT1664((undefined1  [16])aVar27);
    do {
      lVar2 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
      pBVar3 = (this->super_QuadMesh).vertices.items;
      lVar22 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar19;
      uVar21 = (ulong)*(uint *)(lVar2 + lVar22);
      uVar4 = (pBVar3->super_RawBufferView).num;
      auVar14 = auVar34;
      auVar37 = auVar33;
      if ((((uVar21 < uVar4) && (uVar23 = (ulong)*(uint *)(lVar2 + 4 + lVar22), uVar23 < uVar4)) &&
          (uVar16 = (ulong)*(uint *)(lVar2 + 8 + lVar22), uVar16 < uVar4)) &&
         (uVar20 = (ulong)*(uint *)(lVar2 + 0xc + lVar22), uVar20 < uVar4)) {
        pcVar5 = pBVar3[itime].super_RawBufferView.ptr_ofs;
        sVar18 = pBVar3[itime].super_RawBufferView.stride;
        auVar1 = *(undefined1 (*) [16])(pcVar5 + sVar18 * uVar21);
        auVar7 = vcmpps_avx(auVar1,auVar35,6);
        auVar8 = vcmpps_avx(auVar1,auVar36,1);
        auVar7 = vandps_avx(auVar7,auVar8);
        uVar17 = vmovmskps_avx(auVar7);
        if ((~(byte)uVar17 & 7) != 0) goto LAB_012d289e;
        auVar7 = *(undefined1 (*) [16])(pcVar5 + sVar18 * uVar23);
        auVar8 = vcmpps_avx(auVar7,auVar35,6);
        auVar9 = vcmpps_avx(auVar7,auVar36,1);
        auVar8 = vandps_avx(auVar8,auVar9);
        uVar17 = vmovmskps_avx(auVar8);
        if ((~(byte)uVar17 & 7) != 0) goto LAB_012d289e;
        auVar8 = *(undefined1 (*) [16])(pcVar5 + sVar18 * uVar16);
        auVar9 = vcmpps_avx(auVar8,auVar35,6);
        auVar10 = vcmpps_avx(auVar8,auVar36,1);
        auVar9 = vandps_avx(auVar9,auVar10);
        uVar17 = vmovmskps_avx(auVar9);
        if ((~(byte)uVar17 & 7) != 0) goto LAB_012d289e;
        auVar9 = *(undefined1 (*) [16])(pcVar5 + sVar18 * uVar20);
        auVar10 = vcmpps_avx(auVar9,auVar35,6);
        auVar11 = vcmpps_avx(auVar9,auVar36,1);
        auVar10 = vandps_avx(auVar10,auVar11);
        uVar17 = vmovmskps_avx(auVar10);
        if ((~(byte)uVar17 & 7) != 0) goto LAB_012d289e;
        pcVar5 = pBVar3[itime + 1].super_RawBufferView.ptr_ofs;
        sVar18 = pBVar3[itime + 1].super_RawBufferView.stride;
        auVar10 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + uVar21 * sVar18),auVar35,6);
        auVar11 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + uVar21 * sVar18),auVar36,1);
        auVar10 = vandps_avx(auVar10,auVar11);
        uVar17 = vmovmskps_avx(auVar10);
        if ((~(byte)uVar17 & 7) != 0) goto LAB_012d289e;
        auVar10 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + uVar23 * sVar18),auVar35,6);
        auVar11 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + uVar23 * sVar18),auVar36,1);
        auVar10 = vandps_avx(auVar10,auVar11);
        uVar17 = vmovmskps_avx(auVar10);
        if ((~(byte)uVar17 & 7) != 0) goto LAB_012d289e;
        auVar10 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + uVar16 * sVar18),auVar35,6);
        auVar11 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + uVar16 * sVar18),auVar36,1);
        auVar10 = vandps_avx(auVar10,auVar11);
        uVar17 = vmovmskps_avx(auVar10);
        if ((~(byte)uVar17 & 7) != 0) goto LAB_012d289e;
        auVar10 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar18 * uVar20),auVar35,6);
        auVar11 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar18 * uVar20),auVar36,1);
        auVar10 = vandps_avx(auVar10,auVar11);
        uVar17 = vmovmskps_avx(auVar10);
        bVar24 = ((byte)uVar17 & 7) == 7;
        if (bVar24) {
          auVar14 = vminps_avx(auVar1,auVar7);
          auVar37 = vminps_avx(auVar8,auVar9);
          auVar37 = vminps_avx(auVar14,auVar37);
          auVar14 = vmaxps_avx(auVar1,auVar7);
          auVar1 = vmaxps_avx(auVar8,auVar9);
          auVar14 = vmaxps_avx(auVar14,auVar1);
        }
      }
      else {
LAB_012d289e:
        bVar24 = false;
      }
      sVar18 = k;
      if (bVar24) {
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar37,ZEXT416(geomID),0x30);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar14,ZEXT416((uint)uVar19),0x30);
        auVar14 = vminps_avx(auVar26._0_16_,(undefined1  [16])aVar12);
        auVar26 = ZEXT1664(auVar14);
        auVar14 = vmaxps_avx(auVar28._0_16_,(undefined1  [16])aVar13);
        auVar28 = ZEXT1664(auVar14);
        auVar37._0_4_ = aVar13.x + aVar12.x;
        auVar37._4_4_ = aVar13.y + aVar12.y;
        auVar37._8_4_ = aVar13.z + aVar12.z;
        auVar37._12_4_ = aVar13.field_3.w + aVar12.field_3.w;
        auVar14 = vminps_avx(auVar32._0_16_,auVar37);
        auVar32 = ZEXT1664(auVar14);
        auVar14 = vmaxps_avx(auVar30._0_16_,auVar37);
        auVar30 = ZEXT1664(auVar14);
        sVar15 = sVar15 + 1;
        sVar18 = k + 1;
        pPVar6 = prims->items;
        pPVar6[k].lower.field_0.field_1 = aVar12;
        pPVar6[k].upper.field_0.field_1 = aVar13;
      }
      aVar29 = auVar30._0_16_;
      aVar31 = auVar32._0_16_;
      aVar27 = auVar28._0_16_;
      aVar25 = auVar26._0_16_;
      uVar19 = uVar19 + 1;
      k = sVar18;
    } while (uVar19 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar29;
  __return_storage_ptr__->end = sVar15;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }